

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10CachePolicy.cpp
# Opt level: O0

GMM_STATUS __thiscall GmmLib::GmmGen10CachePolicy::InitCachePolicy(GmmGen10CachePolicy *this)

{
  GMM_CACHE_POLICY_ELEMENT *pGVar1;
  GMM_CACHE_POLICY_ELEMENT CachePolicyUsage;
  ulong uVar2;
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar3;
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar4;
  SKU_FEATURE_TABLE *pSVar5;
  WA_TABLE *pWVar6;
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar7;
  short sVar8;
  ushort uVar9;
  byte local_ab;
  byte local_aa;
  byte local_a9;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  GMM_CACHE_POLICY_TBL_ELEMENT *local_78;
  GMM_CACHE_POLICY_TBL_ELEMENT *TblEle_3;
  GMM_CACHE_POLICY_TBL_ELEMENT *TblEle_2;
  GMM_CACHE_POLICY_TBL_ELEMENT *TblEle_1;
  GMM_CACHE_POLICY_TBL_ELEMENT *TblEle;
  GMM_CACHE_POLICY_TBL_ELEMENT UsageEle;
  uint64_t PTEValue;
  uint local_40;
  uint32_t j;
  int32_t CPTblIdx;
  bool CachePolicyError;
  GMM_CACHE_POLICY_TBL_ELEMENT *Entry0;
  GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement;
  uint local_20;
  uint32_t CurrentMaxHDCL1Index;
  uint32_t CurrentMaxIndex;
  uint32_t Usage;
  GmmGen10CachePolicy *this_local;
  
  if ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
      pCachePolicy == (GMM_CACHE_POLICY_ELEMENT *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffefffffffffffff;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value =
         pGVar1[0x20].field_1.Value & 0xfffffffffffffffe |
         (ulong)(((ulong)pSVar5->field_1 >> 0x13 & 1) != 0);
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    local_a9 = 0;
    if (((ulong)pSVar5->field_1 >> 9 & 1) != 0) {
      pWVar6 = Context::GetWaTable((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                                   super_GmmCachePolicyCommon.pGmmLibContext);
      local_a9 = (*(ulong *)&pWVar6->field_0x4 >> 0x23 & 1) != 0 ^ 0xff;
    }
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value =
         pGVar1[0x20].field_1.Value & 0xfffffffffffffffd | (ulong)(local_a9 & 1) << 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value =
         pGVar1[0x20].field_1.Value & 0xfffffffffffffffb |
         (ulong)(((ulong)pSVar5->field_1 >> 0x13 & 1) != 0) << 2;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    local_aa = 0;
    if (((ulong)pSVar5->field_1 >> 0x13 & 1) == 0) {
      pSVar5 = Context::GetSkuTable
                         ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon.pGmmLibContext);
      local_ab = 0;
      if (((ulong)pSVar5->field_1 >> 9 & 1) != 0) {
        pWVar6 = Context::GetWaTable((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                                     super_GmmCachePolicyCommon.pGmmLibContext);
        local_ab = (*(ulong *)&pWVar6->field_0x4 >> 0x23 & 1) != 0 ^ 0xff;
      }
      local_aa = local_ab;
    }
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value =
         pGVar1[0x20].field_1.Value & 0xfffffffffffffff7 | (ulong)(local_aa & 1) << 3;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value =
         pGVar1[0x62].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value =
         pGVar1[0x65].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x65].field_1.Value = pGVar1[0x65].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value =
         pGVar1[0x70].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value =
         pGVar1[0x71].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value =
         pGVar1[0x73].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value =
         pGVar1[0x75].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value =
         pGVar1[0x76].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value =
         pGVar1[0x77].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value =
         pGVar1[0x79].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value =
         pGVar1[0x7a].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value =
         pGVar1[0x7b].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value =
         pGVar1[0x7c].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value =
         pGVar1[0x7d].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value =
         pGVar1[0x7e].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value =
         pGVar1[0x7f].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value =
         pGVar1[0x80].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value =
         pGVar1[0x81].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value =
         pGVar1[0x82].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value =
         pGVar1[0x83].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value =
         pGVar1[0x84].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value =
         pGVar1[0x85].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value =
         pGVar1[0x86].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value =
         pGVar1[0x87].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value =
         pGVar1[0x88].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value =
         pGVar1[0x89].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value =
         pGVar1[0x8b].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value =
         pGVar1[0x8c].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value =
         pGVar1[0x8d].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value =
         pGVar1[0x8e].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value =
         pGVar1[0x8f].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value =
         pGVar1[0x90].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value =
         pGVar1[0xa2].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value =
         pGVar1[0xa3].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value =
         pGVar1[0x99].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value =
         pGVar1[0x9a].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value =
         pGVar1[0xd4].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value =
         pGVar1[0xd5].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value =
         pGVar1[0xd6].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value =
         pGVar1[0xd7].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value =
         pGVar1[0xd8].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value =
         pGVar1[0x9b].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value =
         pGVar1[0x9e].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value =
         pGVar1[0x9f].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value =
         pGVar1[0xa0].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value =
         pGVar1[0xa5].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffffffe;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value =
         pGVar1[0xb2].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value =
         pGVar1[0xb3].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value =
         pGVar1[0xb4].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar5->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffcffff | 0x30000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffefffffffffffff;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value =
         pGVar1[0xf3].field_1.Value & 0xfffffffffffffffe |
         (ulong)(((ulong)pSVar5->field_1 >> 0x16 & 1) != 0);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffff7;
    pSVar5 = Context::GetSkuTable
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value =
         pGVar1[0xf3].field_1.Value & 0xffffffffffffffcf |
         (ulong)(((ulong)pSVar5->field_1 >> 0x16 & 1) != 0) << 4;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffefffffffffffff;
    CurrentMaxHDCL1Index = 0;
    local_20 = 0;
    pCachePolicyTlbElement._4_4_ = 0x2f;
    pGVar7 = Context::GetCachePolicyTlbElement
                       ((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    (pGVar7->LeCC).DwordValue = (pGVar7->LeCC).DwordValue & 0xfffffffc | 1;
    (pGVar7->LeCC).DwordValue = (pGVar7->LeCC).DwordValue & 0xfffffff3 | 8;
    (pGVar7->LeCC).DwordValue = (pGVar7->LeCC).DwordValue & 0xffffffcf;
    (pGVar7->LeCC).DwordValue = (pGVar7->LeCC).DwordValue & 0xffffff7f;
    (pGVar7->LeCC).DwordValue = (pGVar7->LeCC).DwordValue & 0xfffff8ff;
    (pGVar7->LeCC).DwordValue = (pGVar7->LeCC).DwordValue & 0xfffe7fff;
    (pGVar7->LeCC).DwordValue = (pGVar7->LeCC).DwordValue & 0xfff9ffff;
    (pGVar7->L3).UshortValue = (pGVar7->L3).UshortValue & 0xffcf | 0x10;
    (pGVar7->L3).UshortValue = (pGVar7->L3).UshortValue & 0xfffe;
    (pGVar7->L3).UshortValue = (pGVar7->L3).UshortValue & 0xfff1;
    pGVar7->HDCL1 = '\0';
    for (; CurrentMaxHDCL1Index < 0x11e; CurrentMaxHDCL1Index = CurrentMaxHDCL1Index + 1) {
      local_40 = 0xffffffff;
      UsageEle.LeCC = (anon_union_4_3_53f8f047_for_LeCC)0x0;
      UsageEle.L3 = (anon_union_2_3_6e525fdd_for_L3)0x0;
      UsageEle.HDCL1 = '\0';
      UsageEle._7_1_ = 0;
      TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)0x0;
      if (((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy[CurrentMaxHDCL1Index].field_1.Value & 0x10000) != 0) {
        TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)
                 (ulong)(((uint)((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                                 super_GmmCachePolicyCommon.pCachePolicy[CurrentMaxHDCL1Index].
                                 field_1.Value >> 0x10) & 3) << 0x11);
      }
      if (((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy[CurrentMaxHDCL1Index].field_1.Value >> 0xe & 3) != 0) {
        TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)
                 (ulong)((uint)TblEle |
                        ((uint)((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                                super_GmmCachePolicyCommon.pCachePolicy[CurrentMaxHDCL1Index].
                                field_1.Value >> 0xe) & 3) << 0xf);
      }
      if (((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy[CurrentMaxHDCL1Index].field_1.Value >> 0x12 & 1) != 0) {
        TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)(ulong)CONCAT16(1,TblEle._0_6_);
      }
      if (((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy[CurrentMaxHDCL1Index].field_1.Value >> 7 & 7) != 0) {
        TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)
                 (CONCAT44(TblEle._4_4_,
                           (uint)TblEle |
                           ((uint)((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                                   super_GmmCachePolicyCommon.pCachePolicy[CurrentMaxHDCL1Index].
                                   field_1.Value >> 7) & 7) << 8) | 0x80);
      }
      uVar2 = CONCAT44(TblEle._4_4_,
                       (uint)TblEle |
                       ((uint)((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                               super_GmmCachePolicyCommon.pCachePolicy[CurrentMaxHDCL1Index].field_1
                               .Value >> 4) & 3) << 4);
      if ((((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[CurrentMaxHDCL1Index].field_1.Value & 1) == 0) ||
         (((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy[CurrentMaxHDCL1Index].field_1.Value >> 1 & 1) == 0)) {
        if (((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy[CurrentMaxHDCL1Index].field_1.Value & 1) == 0) {
          if (((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
               pCachePolicy[CurrentMaxHDCL1Index].field_1.Value >> 1 & 1) == 0) {
            TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)(uVar2 | 9);
          }
          else {
            TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)(uVar2 | 3);
            if (((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                 super_GmmCachePolicyCommon.pCachePolicy[CurrentMaxHDCL1Index].field_1.Value >> 3 &
                1) != 0) {
              TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)(uVar2 | 2);
            }
          }
        }
        else {
          TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)(uVar2 | 7);
        }
      }
      else {
        TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)(uVar2 | 0xb);
      }
      pGVar3 = TblEle;
      sVar8 = 1;
      if (((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy[CurrentMaxHDCL1Index].field_1.Value >> 2 & 1) != 0) {
        sVar8 = 3;
      }
      uVar9 = sVar8 << 4;
      if (((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pCachePolicy[CurrentMaxHDCL1Index].field_1.Value >> 10 & 7) != 0) {
        TblEle._4_2_ = uVar9 | 1;
        uVar9 = TblEle._4_2_ |
                ((ushort)((this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon.pCachePolicy[CurrentMaxHDCL1Index].field_1.
                          Value >> 10) & 7) << 1;
      }
      TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)CONCAT26(TblEle._6_2_,CONCAT24(uVar9,(uint)TblEle));
      pGVar4 = TblEle;
      TblEle._6_1_ = SUB81(pGVar3,6);
      if (TblEle._6_1_ == '\0') {
        for (PTEValue._4_4_ = 0; PTEValue._4_4_ <= local_20; PTEValue._4_4_ = PTEValue._4_4_ + 1) {
          TblEle_2 = pGVar7 + PTEValue._4_4_;
          if ((((TblEle_2->LeCC).DwordValue == (uint)TblEle) &&
              ((TblEle_2->L3).UshortValue == uVar9)) && (TblEle_2->HDCL1 == '\0')) {
            local_40 = PTEValue._4_4_;
            break;
          }
        }
      }
      else {
        for (PTEValue._4_4_ = 0x30; PTEValue._4_4_ <= pCachePolicyTlbElement._4_4_;
            PTEValue._4_4_ = PTEValue._4_4_ + 1) {
          TblEle_1 = pGVar7 + PTEValue._4_4_;
          if ((((TblEle_1->LeCC).DwordValue == (uint)TblEle) &&
              ((TblEle_1->L3).UshortValue == uVar9)) && (TblEle_1->HDCL1 == TblEle._6_1_)) {
            local_40 = PTEValue._4_4_;
            break;
          }
        }
      }
      if (local_40 == 0xffffffff) {
        if ((TblEle._6_1_ == '\0') || (0x3c < pCachePolicyTlbElement._4_4_)) {
          if (local_20 < 0x30) {
            local_40 = local_20 + 1;
            local_78 = pGVar7 + local_40;
            (local_78->LeCC).DwordValue = (uint)TblEle;
            (local_78->L3).UshortValue = uVar9;
            local_78->HDCL1 = TblEle._6_1_;
            local_20 = local_40;
          }
          else {
            local_40 = 0;
          }
        }
        else {
          local_40 = pCachePolicyTlbElement._4_4_ + 1;
          TblEle_3 = pGVar7 + local_40;
          (TblEle_3->LeCC).DwordValue = (uint)TblEle;
          (TblEle_3->L3).UshortValue = uVar9;
          TblEle_3->HDCL1 = TblEle._6_1_;
          pCachePolicyTlbElement._4_4_ = local_40;
        }
      }
      TblEle = pGVar4;
      memcpy(&local_a0,
             (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy + CurrentMaxHDCL1Index,0x28);
      CachePolicyUsage.field_1 =
           (anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1)uStack_98;
      CachePolicyUsage._0_8_ = local_a0;
      CachePolicyUsage.MemoryObjectOverride = (MEMORY_OBJECT_CONTROL_STATE)(undefined4)local_90;
      CachePolicyUsage.field_3 =
           (anon_union_4_2_78ef2503_for_GMM_CACHE_POLICY_ELEMENT_REC_4)local_90._4_4_;
      CachePolicyUsage.PTE = (GMM_PTE_CACHE_CONTROL_BITS)uStack_88;
      CachePolicyUsage.Override = (undefined4)local_80;
      CachePolicyUsage.IsOverridenByRegkey = local_80._4_4_;
      GmmGen8CachePolicy::GetUsagePTEValue
                ((GmmGen8CachePolicy *)this,CachePolicyUsage,CurrentMaxHDCL1Index,
                 (uint64_t *)&UsageEle);
      (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
      pCachePolicy[CurrentMaxHDCL1Index].PTE.field_4.DwordValue = (uint32_t)UsageEle.LeCC;
      (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
      pCachePolicy[CurrentMaxHDCL1Index].PTE.field_4.HighDwordValue = 0;
      pGVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
               pCachePolicy;
      pGVar1[CurrentMaxHDCL1Index].MemoryObjectOverride.DwordValue =
           pGVar1[CurrentMaxHDCL1Index].MemoryObjectOverride.DwordValue & 0xffffff81 |
           (local_40 & 0x3f) << 1;
      (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
      pCachePolicy[CurrentMaxHDCL1Index].Override = 0xffffffff;
    }
    (this->super_GmmGen9CachePolicy).CurrentMaxMocsIndex = local_20;
    (this->super_GmmGen9CachePolicy).CurrentMaxL1HdcMocsIndex = pCachePolicyTlbElement._4_4_;
    this_local._4_4_ = GMM_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GmmLib::GmmGen10CachePolicy::InitCachePolicy()
{

    __GMM_ASSERTPTR(pCachePolicy, GMM_ERROR);

#define DEFINE_CACHE_ELEMENT(usage, llc, ellc, l3, wt, age, lecc_scc, l3_scc, sso, cos, hdcl1) DEFINE_CP_ELEMENT(usage, llc, ellc, l3, wt, age, 0, lecc_scc, l3_scc, 0, sso, cos, hdcl1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0)
#include "GmmGen10CachePolicy.h"

#define TC_LLC (1)
#define TC_ELLC (0) //Is this supported anymore in TargetCache?
#define TC_LLC_ELLC (2)

#define LeCC_UNCACHEABLE (0x1)
#define LeCC_WT_CACHEABLE (0x2) //Only used as MemPushWRite disqualifier if set along with eLLC-only
#define LeCC_WB_CACHEABLE (0x3)

#define L3_UNCACHEABLE (0x1)
#define L3_WB_CACHEABLE (0x3)

#define DISABLE_SKIP_CACHING_CONTROL (0x0)
#define ENABLE_SKIP_CACHING_CONTROL (0x1)

#define DISABLE_SELF_SNOOP_OVERRIDE (0x0)
#define ENABLE_SELF_SNOOP_OVERRIDE (0x1)
#define ENABLE_SELF_SNOOP_ALWAYS (0x3)
#define CLASS_SERVICE_ZERO 0
    {
        // Define index of cache element
        uint32_t Usage = 0;

        uint32_t                      CurrentMaxIndex        = 0;
        uint32_t                      CurrentMaxHDCL1Index   = GMM_GEN10_HDCL1_MOCS_INDEX_START - 1; // define constant
        GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement = pGmmLibContext->GetCachePolicyTlbElement();

        // index 0 is uncached.
        {
            GMM_CACHE_POLICY_TBL_ELEMENT *Entry0 = &(pCachePolicyTlbElement[0]);
            Entry0->LeCC.Cacheability            = LeCC_UNCACHEABLE;
            Entry0->LeCC.TargetCache             = TC_LLC_ELLC;
            Entry0->LeCC.LRUM                    = 0;
            Entry0->LeCC.ESC                     = DISABLE_SKIP_CACHING_CONTROL;
            Entry0->LeCC.SCC                     = 0;
            Entry0->LeCC.CoS                     = CLASS_SERVICE_ZERO;
            Entry0->LeCC.SelfSnoop               = DISABLE_SELF_SNOOP_OVERRIDE;
            Entry0->L3.Cacheability              = L3_UNCACHEABLE;
            Entry0->L3.ESC                       = DISABLE_SKIP_CACHING_CONTROL;
            Entry0->L3.SCC                       = 0;
            Entry0->HDCL1                        = 0;
        }

        // Process the cache policy and fill in the look up table
        for(; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
        {
            bool                         CachePolicyError = false;
            int32_t                      CPTblIdx         = -1;
            uint32_t                     j                = 0;
            uint64_t                     PTEValue         = 0;
            GMM_CACHE_POLICY_TBL_ELEMENT UsageEle         = {0};
            UsageEle.LeCC.Reserved                        = 0; // Reserved bits zeroe'd, this is so we
                                                               // we can compare the unioned LeCC.DwordValue.
            UsageEle.LeCC.SelfSnoop = DISABLE_SELF_SNOOP_OVERRIDE;
            UsageEle.LeCC.CoS       = CLASS_SERVICE_ZERO;
            UsageEle.LeCC.SCC       = 0;
            UsageEle.LeCC.ESC       = 0;
            if(pCachePolicy[Usage].SSO & ENABLE_SELF_SNOOP_OVERRIDE)
            {
                UsageEle.LeCC.SelfSnoop = pCachePolicy[Usage].SSO & ENABLE_SELF_SNOOP_ALWAYS;
            }
            if(pCachePolicy[Usage].CoS)
            {
                UsageEle.LeCC.CoS = pCachePolicy[Usage].CoS;
            }
            if(pCachePolicy[Usage].HDCL1)
            {
                UsageEle.HDCL1 = 1;
            }
            if(pCachePolicy[Usage].LeCC_SCC)
            {
                UsageEle.LeCC.SCC = pCachePolicy[Usage].LeCC_SCC;
                UsageEle.LeCC.ESC = ENABLE_SKIP_CACHING_CONTROL;
            }
            UsageEle.LeCC.LRUM = pCachePolicy[Usage].AGE;

            // default to LLC/ELLC target cache.
            UsageEle.LeCC.TargetCache  = TC_LLC_ELLC;
            UsageEle.LeCC.Cacheability = LeCC_WB_CACHEABLE;
            if(pCachePolicy[Usage].LLC && pCachePolicy[Usage].ELLC)
            {
                UsageEle.LeCC.TargetCache = TC_LLC_ELLC;
            }
            else if(pCachePolicy[Usage].LLC)
            {
                UsageEle.LeCC.TargetCache = TC_LLC;
            }
            else if(pCachePolicy[Usage].ELLC)
            {
                UsageEle.LeCC.TargetCache = TC_ELLC;
                if(pCachePolicy[Usage].WT)
                {
                    UsageEle.LeCC.Cacheability = LeCC_WT_CACHEABLE;
                }
            }
            else
            {
                UsageEle.LeCC.Cacheability = LeCC_UNCACHEABLE;
            }
            UsageEle.L3.Reserved = 0; // Reserved bits zeroe'd, this is so we
                                      // we can compare the unioned L3.UshortValue.
            UsageEle.L3.ESC          = DISABLE_SKIP_CACHING_CONTROL;
            UsageEle.L3.SCC          = 0;
            UsageEle.L3.Cacheability = pCachePolicy[Usage].L3 ? L3_WB_CACHEABLE : L3_UNCACHEABLE;

            if(pCachePolicy[Usage].L3_SCC)
            {
                UsageEle.L3.ESC = ENABLE_SKIP_CACHING_CONTROL;
                UsageEle.L3.SCC = (uint16_t)pCachePolicy[Usage].L3_SCC;
            }
            //For HDC L1 caching, MOCS Table index 48-61 should be used
            if(UsageEle.HDCL1)
            {
                for(j = GMM_GEN10_HDCL1_MOCS_INDEX_START; j <= CurrentMaxHDCL1Index; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pCachePolicyTlbElement[j];
                    if(TblEle->LeCC.DwordValue == UsageEle.LeCC.DwordValue &&
                       TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                       TblEle->HDCL1 == UsageEle.HDCL1)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }
            else
            {
                for(j = 0; j <= CurrentMaxIndex; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pCachePolicyTlbElement[j];
                    if(TblEle->LeCC.DwordValue == UsageEle.LeCC.DwordValue &&
                       TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                       TblEle->HDCL1 == UsageEle.HDCL1)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }

            // Didn't find the caching settings in one of the already programmed lookup table entries.
            // Need to add a new lookup table entry.
            if(CPTblIdx == -1)
            {
                if(UsageEle.HDCL1 && CurrentMaxHDCL1Index < GMM_GEN9_MAX_NUMBER_MOCS_INDEXES - 1)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &(pCachePolicyTlbElement[++CurrentMaxHDCL1Index]);
                    CPTblIdx                             = CurrentMaxHDCL1Index;

                    TblEle->LeCC.DwordValue = UsageEle.LeCC.DwordValue;
                    TblEle->L3.UshortValue  = UsageEle.L3.UshortValue;
                    TblEle->HDCL1           = UsageEle.HDCL1;
                }
                else if(CurrentMaxIndex < GMM_GEN10_HDCL1_MOCS_INDEX_START)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &(pCachePolicyTlbElement[++CurrentMaxIndex]);
                    CPTblIdx                             = CurrentMaxIndex;

                    TblEle->LeCC.DwordValue = UsageEle.LeCC.DwordValue;
                    TblEle->L3.UshortValue  = UsageEle.L3.UshortValue;
                    TblEle->HDCL1           = UsageEle.HDCL1;
                }
                else
                {
                    // Too many unique caching combinations to program the
                    // MOCS lookup table.
                    CachePolicyError = true;
                    GMM_ASSERTDPF(
                    "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                    "(we only support GMM_GEN_MAX_NUMBER_MOCS_INDEXES = %d)",
                    GMM_GEN9_MAX_NUMBER_MOCS_INDEXES - 1);
                    // Set cache policy index to uncached.
                    CPTblIdx = 0;
                }
            }

            // PTE entries do not control caching on SKL+ (for legacy context)
            if(!GetUsagePTEValue(pCachePolicy[Usage], Usage, &PTEValue))
            {
                CachePolicyError = true;
            }

            pCachePolicy[Usage].PTE.DwordValue     = PTEValue & 0xFFFFFFFF;
            pCachePolicy[Usage].PTE.HighDwordValue = 0;

            pCachePolicy[Usage].MemoryObjectOverride.Gen10.Index = CPTblIdx;

            pCachePolicy[Usage].Override = ALWAYS_OVERRIDE;

            if(CachePolicyError)
            {
                GMM_ASSERTDPF("Cache Policy Init Error: Invalid Cache Programming - Element %d", Usage);
            }
        }
        CurrentMaxMocsIndex      = CurrentMaxIndex;
        CurrentMaxL1HdcMocsIndex = CurrentMaxHDCL1Index;
    }

    return GMM_SUCCESS;
}